

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_table.cc
# Opt level: O1

void __thiscall Table::test(Table *this)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  iterator __position;
  pointer pTVar3;
  bool bVar4;
  uint __val;
  uint uVar5;
  _Base_ptr p_Var6;
  Test *pTVar7;
  ostream *poVar8;
  uint uVar9;
  ObjTable<Test> *__range2;
  _Rb_tree_color _Var10;
  uint __len;
  long lVar11;
  int i;
  ulong uVar12;
  pointer pTVar13;
  int iVar14;
  string __str;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  iVar14 = 0;
  lVar11 = 4000;
  uVar12 = 0;
  do {
    pTVar13 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if (uVar12 < (ulong)((long)(this->super_ObjTable<Test>).
                               super_vector<Test,_std::allocator<Test>_>.
                               super__Vector_base<Test,_std::allocator<Test>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar13 >> 2)) {
      pTVar7 = (Test *)((long)(pTVar13 + 0xfffffffffffffc18) + lVar11);
    }
    else {
      pTVar7 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar12);
    }
    pTVar7->value = iVar14;
    pTVar13 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if (uVar12 + 1000 <
        (ulong)((long)(this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
                      super__Vector_base<Test,_std::allocator<Test>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pTVar13 >> 2)) {
      pTVar7 = (Test *)((long)&pTVar13->value + lVar11);
    }
    else {
      pTVar7 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar12 + 1000);
    }
    pTVar7->value = iVar14 + 2000;
    uVar12 = uVar12 + 1;
    iVar14 = iVar14 + 2;
    lVar11 = lVar11 + 4;
  } while (uVar12 != 10);
  lVar11 = 0;
  do {
    iVar14 = *(int *)((long)&DAT_002610ec + lVar11);
    uVar12 = (ulong)iVar14;
    pTVar13 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if (uVar12 < (ulong)((long)(this->super_ObjTable<Test>).
                               super_vector<Test,_std::allocator<Test>_>.
                               super__Vector_base<Test,_std::allocator<Test>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar13 >> 2)) {
      pTVar7 = pTVar13 + uVar12;
    }
    else {
      pTVar7 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar12);
    }
    pTVar7->value = iVar14 * 2;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x30);
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,100);
  lVar11 = 0;
  do {
    iVar14 = *(int *)((long)&DAT_0026111c + lVar11);
    uVar12 = (ulong)iVar14;
    pTVar13 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if (uVar12 < (ulong)((long)(this->super_ObjTable<Test>).
                               super_vector<Test,_std::allocator<Test>_>.
                               super__Vector_base<Test,_std::allocator<Test>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar13 >> 2)) {
      pTVar7 = pTVar13 + uVar12;
    }
    else {
      pTVar7 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar12);
    }
    pTVar7->value = iVar14 * 3;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x28);
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,200);
  local_50._0_4_ = _S_black;
  do {
    __position._M_current =
         (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
         super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish;
    if ((this->super_ObjTable<Test>).min_sparse ==
        (long)__position._M_current -
        (long)(this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2) {
      ObjTable<Test>::emplace_back_large<int&>(&this->super_ObjTable<Test>,(int *)&local_50);
    }
    else if (__position._M_current ==
             (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
             super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage) {
      std::vector<Test,std::allocator<Test>>::_M_realloc_insert<int&>
                ((vector<Test,std::allocator<Test>> *)this,__position,(int *)&local_50);
    }
    else {
      (__position._M_current)->value = (_Rb_tree_color)local_50;
      (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
      super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish =
           __position._M_current + 1;
    }
    _Var10 = (_Rb_tree_color)local_50 + _S_black;
    bVar4 = (int)(_Rb_tree_color)local_50 < 9;
    local_50._0_4_ = _Var10;
  } while (bVar4);
  local_78 = 0;
  uStack_70 = 0;
  local_60 = std::
             _Function_handler<void_(int,_const_Test_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/obj_table.cc:41:17)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int,_const_Test_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/obj_table.cc:41:17)>
             ::_M_manager;
  pTVar13 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
            super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_start
  ;
  pTVar3 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
           super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (pTVar13 != pTVar3) {
    _Var10 = _S_red;
    do {
      local_50._0_4_ = _Var10;
      if (local_68 == (code *)0x0) goto LAB_0011d895;
      (*local_60)(&local_78,&local_50,pTVar13);
      _Var10 = _Var10 + _S_black;
      pTVar13 = pTVar13 + 1;
    } while (pTVar13 != pTVar3);
  }
  p_Var6 = (this->super_ObjTable<Test>).sparse_elements._M_t._M_impl.super__Rb_tree_header._M_header
           ._M_left;
  p_Var1 = &(this->super_ObjTable<Test>).sparse_elements._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      if ((*(ulong *)(p_Var6 + 1) & 0xffffffff80000000) != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(*(ulong *)(p_Var6 + 1));
      }
      local_50._0_4_ = p_Var6[1]._M_color;
      if (local_68 == (code *)0x0) {
LAB_0011d895:
        std::__throw_bad_function_call();
      }
      (*local_60)(&local_78,&local_50,&p_Var6[1]._M_parent);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2000 : ",7);
  pTVar13 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
            super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_start
  ;
  if ((ulong)((long)(this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
                    super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
                    _M_finish - (long)pTVar13) < 0x1f41) {
    pTVar7 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,2000);
  }
  else {
    pTVar7 = pTVar13 + 2000;
  }
  uVar2 = pTVar7->value;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_0011d814;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_0011d814;
      }
      if (uVar9 < 10000) goto LAB_0011d814;
      uVar12 = uVar12 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_0011d814:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50 + (ulong)(uVar2 >> 0x1f)),__len,__val);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void
    test()
    {
        for (int i = 0; i < 10; ++i) {
            (*this)[i].value = 2 * i;
            (*this)[1000 + i].value = 2 * (1000 + i);
        }
        for (int i: {50, 60, 70, 98, 99, 100, 101, 150, 198, 199, 200, 201}) {
            (*this)[i].value = 2 * i;
        }
        resize(100);
        for (int i: {1, 99, 100, 105, 110, 120, 205, 206, 207, 210}) {
            (*this)[i].value = 3 * i;
        }
        resize(200);

        for (int i = 1; i < 10; ++i) {
            emplace_back(i);
        }

        forEach([](auto i, auto const& item) -> void {
            if (item.value) {
                std::cout << std::to_string(i) << " : " << std::to_string(item.value) << "\n";
            }
        });

        std::cout << "2000 : " << std::to_string((*this)[2000].value) << "\n";
    }